

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O0

size_t __thiscall
cali::CompressedSnapshotRecord::append(CompressedSnapshotRecord *this,size_t n,Node **node_vec)

{
  ulong uVar1;
  unsigned_long *puVar2;
  cali_id_t val;
  size_t sVar3;
  ulong local_70;
  size_t i;
  size_t len;
  size_t blk;
  uchar tmp [40];
  size_t local_28;
  size_t skipped;
  Node **node_vec_local;
  size_t n_local;
  CompressedSnapshotRecord *this_local;
  
  local_28 = 0;
  skipped = (size_t)node_vec;
  n_local = (size_t)this;
  for (node_vec_local = (Node **)n; node_vec_local != (Node **)0x0;
      node_vec_local = (Node **)((long)node_vec_local - uVar1)) {
    puVar2 = std::min<unsigned_long>((unsigned_long *)&node_vec_local,&m_blocksize);
    uVar1 = *puVar2;
    i = 0;
    for (local_70 = 0; local_70 < uVar1; local_70 = local_70 + 1) {
      val = Node::id(*(Node **)(skipped + local_70 * 8));
      sVar3 = vlenc_u64(val,tmp + (i - 8));
      i = sVar3 + i;
    }
    if ((this->m_num_nodes + uVar1 < 0x80) &&
       (this->m_imm_pos + this->m_imm_len + i <= this->m_buffer_len)) {
      anon_unknown.dwarf_8bc3::save_memmove
                (this->m_buffer + i + this->m_imm_pos,this->m_buffer + this->m_imm_pos,
                 this->m_imm_len);
      memcpy(this->m_buffer + 1,&blk,i);
      this->m_imm_pos = i + this->m_imm_pos;
      this->m_num_nodes = uVar1 + this->m_num_nodes;
      *this->m_buffer = *this->m_buffer + (char)uVar1;
    }
    else {
      local_28 = uVar1 + local_28;
    }
    this->m_needed_len = i + this->m_needed_len;
    skipped = uVar1 * 8 + skipped;
  }
  this->m_skipped = local_28 + this->m_skipped;
  return local_28;
}

Assistant:

size_t CompressedSnapshotRecord::append(size_t n, const Node* const node_vec[])
{
    size_t skipped = 0;

    // blockwise encode, size check, and copy
    while (n > 0) {
        unsigned char tmp[m_blocksize * 10];
        size_t        blk = std::min(n, m_blocksize);
        size_t        len = 0;

        // encode to temp buffer
        for (size_t i = 0; i < blk; ++i)
            len += vlenc_u64(node_vec[i]->id(), tmp + len);

        // size check, copy to actual buffer
        if (m_num_nodes + blk < 128 && m_imm_pos + m_imm_len + len <= m_buffer_len) {
            ::save_memmove(m_buffer + m_imm_pos + len, m_buffer + m_imm_pos, m_imm_len);
            memcpy(m_buffer + 1, tmp, len);

            m_imm_pos += len;
            m_num_nodes += blk;
            m_buffer[0] += blk;
        } else {
            skipped += blk;
        }

        m_needed_len += len;

        // advance
        node_vec += blk;
        n -= blk;
    }

    m_skipped += skipped;

    return skipped;
}